

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::parseEnvVar(Lexer *this)

{
  string *psVar1;
  char *__name;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  
  (this->stringValue_)._M_string_length = 0;
  psVar1 = &this->stringValue_;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  while( true ) {
    nextChar(this,true);
    bVar2 = eof(this);
    if (bVar2) break;
    if (this->currentChar_ != 0x5f) {
      iVar3 = isalnum(this->currentChar_);
      if (iVar3 == 0) break;
    }
    std::__cxx11::string::push_back((char)psVar1);
  }
  __name = (psVar1->_M_dataplus)._M_p;
  pcVar4 = getenv(__name);
  if (pcVar4 == (char *)0x0) {
    (this->stringValue_)._M_string_length = 0;
    *__name = '\0';
  }
  else {
    std::__cxx11::string::assign((char *)psVar1);
  }
  return String;
}

Assistant:

Token Lexer::parseEnvVar() {
  stringValue_.clear();
  nextChar(); // skip leading '$'

  while (!eof() && (currentChar() == '_' || std::isalnum(currentChar()))) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  if (char* value = getenv(stringValue_.c_str()); value != nullptr) {
    stringValue_ = value;
  } else {
    stringValue_.clear();
  }

  return Token::String;
}